

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
::disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(char *)((long)pointer + 0x168) == '\x01') {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
                 ((long)pointer + 0x170));
    }
    if (*(char *)((long)pointer + 8) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x10));
    }
    ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase((ImmediatePromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x198);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }